

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall Units_hasUnitsName_Test::TestBody(Units_hasUnitsName_Test *this)

{
  string *psVar1;
  char cVar2;
  AssertionResult gtest_ar_;
  UnitsPtr u;
  ModelPtr m;
  AssertionResult local_88;
  long local_78 [2];
  long *local_68;
  AssertHelper local_60 [8];
  long *local_58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48 [2];
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  shared_ptr *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Model::create();
  libcellml::Units::create();
  psVar1 = local_38;
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a_unit","");
  libcellml::NamedEntity::setName(psVar1);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"micro","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58);
  libcellml::Units::addUnit((StandardUnit)local_38,(string *)0x0,1.0,1.0,(string *)&local_88);
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Model::addUnits(local_28);
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a_unit","");
  cVar2 = libcellml::Model::hasUnits((string *)local_28);
  local_58 = (long *)CONCAT71(local_58._1_7_,cVar2);
  local_50.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((long *)local_88._0_8_ == local_78) {
    if (cVar2 != '\0') goto LAB_001231a9;
  }
  else {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
    if (((ulong)local_58 & 1) != 0) goto LAB_001231a9;
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_88,(char *)&local_58,"m->hasUnits(\"a_unit\")","false");
  testing::internal::AssertHelper::AssertHelper
            (local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
             ,0x107,(char *)local_88._0_8_);
  testing::internal::AssertHelper::operator=(local_60,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(local_60);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  if (((local_68 != (long *)0x0) && (cVar2 = testing::internal::IsTrue(true), cVar2 != '\0')) &&
     (local_68 != (long *)0x0)) {
    (**(code **)(*local_68 + 8))();
  }
LAB_001231a9:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_50,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Units, hasUnitsName)
{
    libcellml::ModelPtr m = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("a_unit");

    u->addUnit(libcellml::Units::StandardUnit::AMPERE, "micro");
    m->addUnits(u);
    EXPECT_TRUE(m->hasUnits("a_unit"));
}